

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_size(void)

{
  initializer_list<int> input;
  undefined4 local_94;
  size_type local_90;
  undefined4 local_84;
  size_type local_80 [2];
  int local_70 [4];
  iterator local_60;
  undefined8 local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_48[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xc6,"void api_dynamic_suite::dynamic_size()",local_48,&local_4c);
  local_70[0] = 0xb;
  local_70[1] = 0x16;
  local_70[2] = 0x21;
  local_70[3] = 0x2c;
  local_60 = local_70;
  local_58 = 4;
  input._M_len = 4;
  input._M_array = local_60;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_80[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_84 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,200,"void api_dynamic_suite::dynamic_size()",local_80,&local_84);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::size
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_94 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xca,"void api_dynamic_suite::dynamic_size()",&local_90,&local_94);
  return;
}

Assistant:

void dynamic_size()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.push_back(55);
    BOOST_TEST_EQ(span.size(), 4);
}